

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O3

void do_connect(uv_loop_t *loop,uv_tcp_t *tcp_client)

{
  uv_loop_t *puVar1;
  int iVar2;
  int iVar3;
  undefined8 *extraout_RDX;
  uv_tcp_t *puVar4;
  uv_tcp_t *puVar5;
  uv_stream_t *server;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  void *pvStack_88;
  undefined1 auStack_80 [16];
  undefined1 auStack_70 [16];
  uv__queue *puStack_60;
  undefined1 auStack_58 [16];
  uv__queue *puStack_48;
  undefined1 auStack_40 [16];
  uv__queue *puStack_30;
  undefined1 local_28 [32];
  
  puStack_30 = (uv__queue *)0x1c5935;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)(local_28 + 0x10));
  local_28._8_8_ = SEXT48(iVar2);
  local_28._0_8_ = (uv_connect_t *)0x0;
  if ((uv_loop_t *)local_28._8_8_ == (uv_loop_t *)0x0) {
    puStack_30 = (uv__queue *)0x1c595e;
    iVar2 = uv_tcp_init(loop,&::tcp_client);
    local_28._8_8_ = SEXT48(iVar2);
    local_28._0_8_ = (uv_connect_t *)0x0;
    if ((uv_loop_t *)local_28._8_8_ != (uv_loop_t *)0x0) goto LAB_001c59c4;
    puStack_30 = (uv__queue *)0x1c5997;
    iVar2 = uv_tcp_connect(&connect_req,&::tcp_client,(sockaddr *)(local_28 + 0x10),connect_cb);
    local_28._8_8_ = SEXT48(iVar2);
    local_28._0_8_ = (uv_connect_t *)0x0;
    if ((uv_loop_t *)local_28._8_8_ == (uv_loop_t *)0x0) {
      return;
    }
  }
  else {
    puStack_30 = (uv__queue *)0x1c59c4;
    do_connect_cold_1();
LAB_001c59c4:
    puStack_30 = (uv__queue *)0x1c59d1;
    do_connect_cold_2();
  }
  puVar4 = (uv_tcp_t *)local_28;
  puStack_30 = (uv__queue *)run_test_tcp_close_reset_client_after_shutdown;
  do_connect_cold_3();
  puVar5 = (uv_tcp_t *)auStack_40;
  puStack_48 = (uv__queue *)0x1c59e8;
  puStack_30 = (uv__queue *)loop;
  ::loop = uv_default_loop();
  puStack_48 = (uv__queue *)0x1c59f7;
  start_server(::loop,puVar4);
  client_close = 1;
  shutdown_before_close = 1;
  puStack_48 = (uv__queue *)0x1c5a14;
  do_connect(::loop,puVar4);
  auStack_40._8_8_ = SEXT48(write_cb_called);
  auStack_40._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_40._8_8_ == (uv_loop_t *)0x0) {
    auStack_40._8_8_ = SEXT48(close_cb_called);
    auStack_40._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_40._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5b74;
    auStack_40._8_8_ = SEXT48(shutdown_cb_called);
    auStack_40._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_40._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5b81;
    puStack_48 = (uv__queue *)0x1c5a8b;
    iVar2 = uv_run(::loop,UV_RUN_DEFAULT);
    puVar1 = ::loop;
    auStack_40._8_8_ = SEXT48(iVar2);
    auStack_40._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_40._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5b8e;
    auStack_40._8_8_ = (uv_loop_t *)0x4;
    auStack_40._0_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)auStack_40._0_8_ != (uv_loop_t *)0x4) goto LAB_001c5b9b;
    auStack_40._8_8_ = SEXT48(close_cb_called);
    auStack_40._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_40._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5ba8;
    auStack_40._8_8_ = (uv_loop_t *)0x1;
    auStack_40._0_8_ = SEXT48(shutdown_cb_called);
    if ((uv_loop_t *)auStack_40._0_8_ != (uv_loop_t *)0x1) goto LAB_001c5bb5;
    puStack_48 = (uv__queue *)0x1c5b2a;
    uv_walk(::loop,close_walk_cb,(void *)0x0);
    puStack_48 = (uv__queue *)0x1c5b34;
    uv_run(puVar1,UV_RUN_DEFAULT);
    auStack_40._8_8_ = (uv_loop_t *)0x0;
    puStack_48 = (uv__queue *)0x1c5b49;
    iVar2 = uv_loop_close(::loop);
    auStack_40._0_8_ = SEXT48(iVar2);
    loop = puVar1;
    if (auStack_40._8_8_ == auStack_40._0_8_) {
      puStack_48 = (uv__queue *)0x1c5b5f;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_48 = (uv__queue *)0x1c5b74;
    run_test_tcp_close_reset_client_after_shutdown_cold_1();
LAB_001c5b74:
    puStack_48 = (uv__queue *)0x1c5b81;
    run_test_tcp_close_reset_client_after_shutdown_cold_2();
LAB_001c5b81:
    puStack_48 = (uv__queue *)0x1c5b8e;
    run_test_tcp_close_reset_client_after_shutdown_cold_3();
LAB_001c5b8e:
    puStack_48 = (uv__queue *)0x1c5b9b;
    run_test_tcp_close_reset_client_after_shutdown_cold_4();
LAB_001c5b9b:
    puStack_48 = (uv__queue *)0x1c5ba8;
    run_test_tcp_close_reset_client_after_shutdown_cold_5();
LAB_001c5ba8:
    puStack_48 = (uv__queue *)0x1c5bb5;
    run_test_tcp_close_reset_client_after_shutdown_cold_6();
LAB_001c5bb5:
    puStack_48 = (uv__queue *)0x1c5bc2;
    run_test_tcp_close_reset_client_after_shutdown_cold_7();
  }
  puStack_48 = (uv__queue *)run_test_tcp_close_reset_accepted;
  run_test_tcp_close_reset_client_after_shutdown_cold_8();
  puVar4 = (uv_tcp_t *)auStack_58;
  puStack_60 = (uv__queue *)0x1c5bd9;
  puStack_48 = (uv__queue *)loop;
  ::loop = uv_default_loop();
  puStack_60 = (uv__queue *)0x1c5be8;
  start_server(::loop,puVar5);
  client_close = 0;
  shutdown_before_close = 0;
  puStack_60 = (uv__queue *)0x1c5c05;
  do_connect(::loop,puVar5);
  auStack_58._8_8_ = SEXT48(write_cb_called);
  auStack_58._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_58._8_8_ == (uv_loop_t *)0x0) {
    auStack_58._8_8_ = SEXT48(close_cb_called);
    auStack_58._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_58._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5d65;
    auStack_58._8_8_ = SEXT48(shutdown_cb_called);
    auStack_58._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_58._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5d72;
    puStack_60 = (uv__queue *)0x1c5c7c;
    iVar2 = uv_run(::loop,UV_RUN_DEFAULT);
    puVar1 = ::loop;
    auStack_58._8_8_ = SEXT48(iVar2);
    auStack_58._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_58._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5d7f;
    auStack_58._8_8_ = (uv_loop_t *)0x4;
    auStack_58._0_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)auStack_58._0_8_ != (uv_loop_t *)0x4) goto LAB_001c5d8c;
    auStack_58._8_8_ = (uv_loop_t *)0x1;
    auStack_58._0_8_ = SEXT48(close_cb_called);
    if ((uv_loop_t *)auStack_58._0_8_ != (uv_loop_t *)0x1) goto LAB_001c5d99;
    auStack_58._8_8_ = SEXT48(shutdown_cb_called);
    auStack_58._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_58._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5da6;
    puStack_60 = (uv__queue *)0x1c5d1b;
    uv_walk(::loop,close_walk_cb,(void *)0x0);
    puStack_60 = (uv__queue *)0x1c5d25;
    uv_run(puVar1,UV_RUN_DEFAULT);
    auStack_58._8_8_ = (uv_loop_t *)0x0;
    puStack_60 = (uv__queue *)0x1c5d3a;
    iVar2 = uv_loop_close(::loop);
    auStack_58._0_8_ = SEXT48(iVar2);
    loop = puVar1;
    if (auStack_58._8_8_ == auStack_58._0_8_) {
      puStack_60 = (uv__queue *)0x1c5d50;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_60 = (uv__queue *)0x1c5d65;
    run_test_tcp_close_reset_accepted_cold_1();
LAB_001c5d65:
    puStack_60 = (uv__queue *)0x1c5d72;
    run_test_tcp_close_reset_accepted_cold_2();
LAB_001c5d72:
    puStack_60 = (uv__queue *)0x1c5d7f;
    run_test_tcp_close_reset_accepted_cold_3();
LAB_001c5d7f:
    puStack_60 = (uv__queue *)0x1c5d8c;
    run_test_tcp_close_reset_accepted_cold_4();
LAB_001c5d8c:
    puStack_60 = (uv__queue *)0x1c5d99;
    run_test_tcp_close_reset_accepted_cold_5();
LAB_001c5d99:
    puStack_60 = (uv__queue *)0x1c5da6;
    run_test_tcp_close_reset_accepted_cold_6();
LAB_001c5da6:
    puStack_60 = (uv__queue *)0x1c5db3;
    run_test_tcp_close_reset_accepted_cold_7();
  }
  puStack_60 = (uv__queue *)run_test_tcp_close_reset_accepted_after_shutdown;
  run_test_tcp_close_reset_accepted_cold_8();
  puVar5 = (uv_tcp_t *)auStack_70;
  auStack_80._8_8_ = (uv_loop_t *)0x1c5dca;
  puStack_60 = (uv__queue *)loop;
  ::loop = uv_default_loop();
  auStack_80._8_8_ = (uv_loop_t *)0x1c5dd9;
  start_server(::loop,puVar4);
  client_close = 0;
  shutdown_before_close = 1;
  auStack_80._8_8_ = (uv_loop_t *)0x1c5df6;
  do_connect(::loop,puVar4);
  auStack_70._8_8_ = SEXT48(write_cb_called);
  auStack_70._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_70._8_8_ == (uv_loop_t *)0x0) {
    auStack_70._8_8_ = SEXT48(close_cb_called);
    auStack_70._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_70._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5f56;
    auStack_70._8_8_ = SEXT48(shutdown_cb_called);
    auStack_70._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_70._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5f63;
    auStack_80._8_8_ = (uv_loop_t *)0x1c5e6d;
    iVar2 = uv_run(::loop,UV_RUN_DEFAULT);
    puVar1 = ::loop;
    auStack_70._8_8_ = SEXT48(iVar2);
    auStack_70._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_70._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5f70;
    auStack_70._8_8_ = (uv_loop_t *)0x4;
    auStack_70._0_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)auStack_70._0_8_ != (uv_loop_t *)0x4) goto LAB_001c5f7d;
    auStack_70._8_8_ = SEXT48(close_cb_called);
    auStack_70._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_70._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5f8a;
    auStack_70._8_8_ = (uv_loop_t *)0x1;
    auStack_70._0_8_ = SEXT48(shutdown_cb_called);
    if ((uv_loop_t *)auStack_70._0_8_ != (uv_loop_t *)0x1) goto LAB_001c5f97;
    auStack_80._8_8_ = (uv_loop_t *)0x1c5f0c;
    uv_walk(::loop,close_walk_cb,(void *)0x0);
    auStack_80._8_8_ = (uv_loop_t *)0x1c5f16;
    uv_run(puVar1,UV_RUN_DEFAULT);
    auStack_70._8_8_ = (uv_loop_t *)0x0;
    auStack_80._8_8_ = (uv_loop_t *)0x1c5f2b;
    iVar2 = uv_loop_close(::loop);
    auStack_70._0_8_ = SEXT48(iVar2);
    loop = puVar1;
    if (auStack_70._8_8_ == auStack_70._0_8_) {
      auStack_80._8_8_ = (uv_loop_t *)0x1c5f41;
      uv_library_shutdown();
      return;
    }
  }
  else {
    auStack_80._8_8_ = (uv_loop_t *)0x1c5f56;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_1();
LAB_001c5f56:
    auStack_80._8_8_ = (uv_loop_t *)0x1c5f63;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_2();
LAB_001c5f63:
    auStack_80._8_8_ = (uv_loop_t *)0x1c5f70;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_3();
LAB_001c5f70:
    auStack_80._8_8_ = (uv_loop_t *)0x1c5f7d;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_4();
LAB_001c5f7d:
    auStack_80._8_8_ = (uv_loop_t *)0x1c5f8a;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_5();
LAB_001c5f8a:
    auStack_80._8_8_ = (uv_loop_t *)0x1c5f97;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_6();
LAB_001c5f97:
    auStack_80._8_8_ = (uv_loop_t *)0x1c5fa4;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_7();
  }
  auStack_80._8_8_ = run_test_tcp_close_reset_accepted_after_socket_shutdown;
  run_test_tcp_close_reset_accepted_after_shutdown_cold_8();
  iVar2 = (int)&pvStack_88;
  auStack_80._8_8_ = loop;
  ::loop = uv_default_loop();
  start_server(::loop,puVar5);
  client_close = 0;
  shutdown_before_close = 2;
  do_connect(::loop,puVar5);
  auStack_80._0_8_ = SEXT48(write_cb_called);
  pvStack_88 = (void *)0x0;
  if ((void *)auStack_80._0_8_ == (void *)0x0) {
    auStack_80._0_8_ = SEXT48(close_cb_called);
    pvStack_88 = (void *)0x0;
    if ((void *)auStack_80._0_8_ != (void *)0x0) goto LAB_001c6147;
    auStack_80._0_8_ = SEXT48(shutdown_cb_called);
    pvStack_88 = (void *)0x0;
    if ((void *)auStack_80._0_8_ != (void *)0x0) goto LAB_001c6154;
    iVar3 = uv_run(::loop,UV_RUN_DEFAULT);
    puVar1 = ::loop;
    auStack_80._0_8_ = SEXT48(iVar3);
    pvStack_88 = (void *)0x0;
    if ((void *)auStack_80._0_8_ != (void *)0x0) goto LAB_001c6161;
    auStack_80._0_8_ = (void *)0x4;
    pvStack_88 = (void *)(long)write_cb_called;
    if (pvStack_88 != (void *)0x4) goto LAB_001c616e;
    auStack_80._0_8_ = (void *)0x1;
    pvStack_88 = (void *)(long)close_cb_called;
    if (pvStack_88 != (void *)0x1) goto LAB_001c617b;
    auStack_80._0_8_ = SEXT48(shutdown_cb_called);
    pvStack_88 = (void *)0x0;
    if ((void *)auStack_80._0_8_ != (void *)0x0) goto LAB_001c6188;
    uv_walk(::loop,close_walk_cb,(void *)0x0);
    uv_run(puVar1,UV_RUN_DEFAULT);
    auStack_80._0_8_ = (void *)0x0;
    iVar3 = uv_loop_close(::loop);
    pvStack_88 = (void *)(long)iVar3;
    if ((void *)auStack_80._0_8_ == pvStack_88) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_1();
LAB_001c6147:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_2();
LAB_001c6154:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_3();
LAB_001c6161:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_4();
LAB_001c616e:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_5();
LAB_001c617b:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_6();
LAB_001c6188:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_7();
  }
  server = (uv_stream_t *)auStack_80;
  run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_8();
  if (iVar2 == 0) {
    iVar2 = uv_tcp_init(::loop,&tcp_accepted);
    if (iVar2 == 0) {
      iVar2 = uv_accept(server,(uv_stream_t *)&tcp_accepted);
      if (iVar2 == 0) {
        uv_read_start((uv_stream_t *)&tcp_accepted,alloc_cb,read_cb);
        return;
      }
      goto LAB_001c6254;
    }
  }
  else {
    connection_cb_cold_1();
  }
  connection_cb_cold_2();
LAB_001c6254:
  connection_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return;
}

Assistant:

static void do_connect(uv_loop_t* loop, uv_tcp_t* tcp_client) {
  struct sockaddr_in addr;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init(loop, tcp_client);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     tcp_client,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT_OK(r);
}